

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_sqrt(secp256k1_fe *a,secp256k1_fe *k)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  secp256k1_fe r2;
  secp256k1_fe r1;
  
  uVar1 = secp256k1_fe_sqrt(&r1,a);
  if (uVar1 == (k == (secp256k1_fe *)0x0)) {
    pcVar4 = "test condition failed: (v == 0) == (k == NULL)";
    uVar3 = 0xc84;
LAB_00135e7d:
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,uVar3,pcVar4);
    abort();
  }
  if (k != (secp256k1_fe *)0x0) {
    secp256k1_fe_negate_unchecked(&r2,&r1,1);
    secp256k1_fe_add(&r1,k);
    secp256k1_fe_add(&r2,k);
    secp256k1_fe_normalize(&r1);
    secp256k1_fe_normalize(&r2);
    iVar2 = secp256k1_fe_is_zero(&r1);
    if (iVar2 == 0) {
      iVar2 = secp256k1_fe_is_zero(&r2);
      if (iVar2 == 0) {
        pcVar4 = "test condition failed: secp256k1_fe_is_zero(&r1) || secp256k1_fe_is_zero(&r2)";
        uVar3 = 0xc8b;
        goto LAB_00135e7d;
      }
    }
  }
  return;
}

Assistant:

static void test_sqrt(const secp256k1_fe *a, const secp256k1_fe *k) {
    secp256k1_fe r1, r2;
    int v = secp256k1_fe_sqrt(&r1, a);
    CHECK((v == 0) == (k == NULL));

    if (k != NULL) {
        /* Check that the returned root is +/- the given known answer */
        secp256k1_fe_negate(&r2, &r1, 1);
        secp256k1_fe_add(&r1, k); secp256k1_fe_add(&r2, k);
        secp256k1_fe_normalize(&r1); secp256k1_fe_normalize(&r2);
        CHECK(secp256k1_fe_is_zero(&r1) || secp256k1_fe_is_zero(&r2));
    }
}